

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O0

void __thiscall libsbox::BindRule::BindRule(BindRule *this,string *inside,string *outside,int flags)

{
  int flags_local;
  string *outside_local;
  string *inside_local;
  BindRule *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)inside);
  std::__cxx11::string::string((string *)&this->outside_,(string *)outside);
  this->flags_ = flags;
  return;
}

Assistant:

BindRule::BindRule(const std::string &inside, const std::string &outside, int flags)
    : inside_(inside), outside_(outside), flags_(flags) {}